

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

long __thiscall
duckdb::Interpolator<false>::Operation<long,long,duckdb::QuantileDirect<long>>
          (Interpolator<false> *this,long *v_t,Vector *result,QuantileDirect<long> *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  duckdb *pdVar4;
  long lVar5;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>_>_> __comp_01;
  bool bVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  long result_1;
  string local_50;
  long local_30;
  
  bVar6 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  local_50._M_dataplus._M_p = (pointer)accessor;
  local_50._M_string_length = (size_type)accessor;
  local_50.field_2._M_local_buf[0] = bVar6;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar7 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar6;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    pdVar4 = (duckdb *)v_t[this->FRN];
    bVar6 = TryCast::Operation<long,long>((int64_t)pdVar4,&local_30,false);
    if (!bVar6) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar4,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar7 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar6;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    local_50._M_dataplus._M_p = (pointer)accessor;
    local_50._M_string_length = (size_type)accessor;
    local_50.field_2._M_local_buf[0] = bVar6;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar7 = (long)(iVar2 * 8 + iVar1 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar6;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    pdVar4 = (duckdb *)v_t[this->FRN];
    bVar6 = TryCast::Operation<long,long>((int64_t)pdVar4,&local_30,false);
    lVar5 = local_30;
    if (!bVar6) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar4,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    pdVar4 = (duckdb *)v_t[this->CRN];
    bVar6 = TryCast::Operation<long,long>((int64_t)pdVar4,&local_30,false);
    if (!bVar6) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar4,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_30 = (long)((double)(local_30 - lVar5) *
                      (this->RN -
                      (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                     (double)lVar5);
  }
  return local_30;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}